

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O0

Aig_Man_t * Aig_ManRemap(Aig_Man_t *p,Vec_Ptr_t *vMap)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Aig_Man_t *p_00;
  char *pcVar5;
  Vec_Int_t *pVVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pAVar8;
  void *pvVar9;
  long *plVar10;
  undefined8 *puVar11;
  Aig_Obj_t *pAVar12;
  int local_34;
  int nTruePis;
  int i;
  Aig_Obj_t *pObjMapped;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Vec_Ptr_t *vMap_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p);
  p_00 = Aig_ManStart(iVar1);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar5;
  p_00->nAsserts = p->nAsserts;
  p_00->nConstrs = p->nConstrs;
  p_00->nBarBufs = p->nBarBufs;
  if ((p->vFlopNums != (Vec_Int_t *)0x0) && (iVar1 = Vec_IntSize(p->vFlopNums), iVar1 != p->nRegs))
  {
    __assert_fail("p->vFlopNums == NULL || Vec_IntSize(p->vFlopNums) == p->nRegs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigScl.c"
                  ,0x3a,"Aig_Man_t *Aig_ManRemap(Aig_Man_t *, Vec_Ptr_t *)");
  }
  if (p->vFlopNums != (Vec_Int_t *)0x0) {
    pVVar6 = Vec_IntDup(p->vFlopNums);
    p_00->vFlopNums = pVVar6;
  }
  if (p->vFlopReprs != (Vec_Int_t *)0x0) {
    pVVar6 = Vec_IntDup(p->vFlopReprs);
    p_00->vFlopReprs = pVVar6;
  }
  Aig_ManCleanData(p);
  pAVar7 = Aig_ManConst1(p_00);
  pAVar8 = Aig_ManConst1(p);
  (pAVar8->field_5).pData = pAVar7;
  for (local_34 = 0; iVar1 = Vec_PtrSize(p->vCis), local_34 < iVar1; local_34 = local_34 + 1) {
    pvVar9 = Vec_PtrEntry(p->vCis,local_34);
    pAVar7 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar9 + 0x28) = pAVar7;
  }
  iVar1 = Aig_ManCiNum(p);
  iVar2 = Aig_ManRegNum(p);
  if (p->vFlopReprs != (Vec_Int_t *)0x0) {
    local_34 = Aig_ManCiNum(p);
    iVar3 = Aig_ManRegNum(p);
    for (local_34 = local_34 - iVar3; iVar3 = Vec_PtrSize(p->vCis), local_34 < iVar3;
        local_34 = local_34 + 1) {
      plVar10 = (long *)Vec_PtrEntry(p->vCis,local_34);
      iVar3 = Vec_IntEntry(p->vFlopNums,local_34 - (iVar1 - iVar2));
      *plVar10 = (long)iVar3;
    }
  }
  local_34 = 0;
  do {
    iVar3 = Vec_PtrSize(p->vCis);
    if (iVar3 <= local_34) {
      if (p->vFlopReprs != (Vec_Int_t *)0x0) {
        local_34 = Aig_ManCiNum(p);
        iVar1 = Aig_ManRegNum(p);
        for (local_34 = local_34 - iVar1; iVar1 = Vec_PtrSize(p->vCis), local_34 < iVar1;
            local_34 = local_34 + 1) {
          puVar11 = (undefined8 *)Vec_PtrEntry(p->vCis,local_34);
          *puVar11 = 0;
        }
      }
      for (local_34 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_34 < iVar1; local_34 = local_34 + 1) {
        pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_34);
        if (pAVar7 != (Aig_Obj_t *)0x0) {
          iVar1 = Aig_ObjIsBuf(pAVar7);
          if (iVar1 == 0) {
            iVar1 = Aig_ObjIsNode(pAVar7);
            if (iVar1 != 0) {
              pAVar8 = Aig_ObjChild0Copy(pAVar7);
              pAVar12 = Aig_ObjChild1Copy(pAVar7);
              pAVar8 = Aig_And(p_00,pAVar8,pAVar12);
              (pAVar7->field_5).pData = pAVar8;
            }
          }
          else {
            pAVar8 = Aig_ObjChild0Copy(pAVar7);
            (pAVar7->field_5).pData = pAVar8;
          }
        }
      }
      for (local_34 = 0; iVar1 = Vec_PtrSize(p->vCos), local_34 < iVar1; local_34 = local_34 + 1) {
        pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_34);
        pAVar7 = Aig_ObjChild0Copy(pAVar7);
        Aig_ObjCreateCo(p_00,pAVar7);
      }
      iVar1 = Aig_ManNodeNum(p);
      iVar2 = Aig_ManNodeNum(p_00);
      if (iVar2 <= iVar1) {
        iVar1 = Aig_ManRegNum(p);
        Aig_ManSetRegNum(p_00,iVar1);
        iVar1 = Aig_ManCheck(p_00);
        if (iVar1 == 0) {
          printf("Aig_ManRemap(): The check has failed.\n");
        }
        return p_00;
      }
      __assert_fail("Aig_ManNodeNum(p) >= Aig_ManNodeNum(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigScl.c"
                    ,0x6b,"Aig_Man_t *Aig_ManRemap(Aig_Man_t *, Vec_Ptr_t *)");
    }
    pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,local_34);
    pAVar12 = (Aig_Obj_t *)Vec_PtrEntry(vMap,local_34);
    pAVar7 = Aig_Regular(pAVar12);
    pAVar7 = (Aig_Obj_t *)(pAVar7->field_5).pData;
    iVar3 = Aig_IsComplement(pAVar12);
    pAVar7 = Aig_NotCond(pAVar7,iVar3);
    (pAVar8->field_5).pData = pAVar7;
    if (((p_00->vFlopReprs != (Vec_Int_t *)0x0) && (iVar1 - iVar2 <= local_34)) &&
       (pAVar8 != pAVar12)) {
      pVVar6 = p_00->vFlopReprs;
      iVar3 = Aig_ObjCioId(pAVar8);
      Vec_IntPush(pVVar6,iVar3);
      pAVar7 = Aig_Regular(pAVar12);
      iVar3 = Aig_ObjIsConst1(pAVar7);
      if (iVar3 == 0) {
        iVar3 = Aig_IsComplement(pAVar12);
        if (iVar3 != 0) {
          __assert_fail("!Aig_IsComplement(pObjMapped)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigScl.c"
                        ,0x56,"Aig_Man_t *Aig_ManRemap(Aig_Man_t *, Vec_Ptr_t *)");
        }
        iVar3 = Aig_ObjIsCi(pAVar12);
        if (iVar3 == 0) {
          __assert_fail("Aig_ObjIsCi(pObjMapped)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigScl.c"
                        ,0x57,"Aig_Man_t *Aig_ManRemap(Aig_Man_t *, Vec_Ptr_t *)");
        }
        iVar3 = Aig_ObjCioId(pAVar8);
        iVar4 = Aig_ObjCioId(pAVar12);
        if (iVar3 == iVar4) {
          __assert_fail("Aig_ObjCioId(pObj) != Aig_ObjCioId(pObjMapped)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigScl.c"
                        ,0x58,"Aig_Man_t *Aig_ManRemap(Aig_Man_t *, Vec_Ptr_t *)");
        }
        pVVar6 = p_00->vFlopReprs;
        iVar3 = Aig_ObjCioId(pAVar12);
        Vec_IntPush(pVVar6,iVar3);
      }
      else {
        Vec_IntPush(p_00->vFlopReprs,-1);
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Remaps the manager.]

  Description [Map in the array specifies for each CI node the node that
  should be used after remapping.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Aig_ManRemap( Aig_Man_t * p, Vec_Ptr_t * vMap )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjMapped;
    int i, nTruePis;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nAsserts = p->nAsserts;
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    assert( p->vFlopNums == NULL || Vec_IntSize(p->vFlopNums) == p->nRegs );
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    if ( p->vFlopReprs )
        pNew->vFlopReprs = Vec_IntDup( p->vFlopReprs );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi(pNew);
    // implement the mapping
    nTruePis = Aig_ManCiNum(p)-Aig_ManRegNum(p);
    if ( p->vFlopReprs )
    {
        Aig_ManForEachLoSeq( p, pObj, i )
            pObj->pNext = (Aig_Obj_t *)(long)Vec_IntEntry( p->vFlopNums, i-nTruePis );
    }
    Aig_ManForEachCi( p, pObj, i )
    {
        pObjMapped = (Aig_Obj_t *)Vec_PtrEntry( vMap, i );
        pObj->pData = Aig_NotCond( (Aig_Obj_t *)Aig_Regular(pObjMapped)->pData, Aig_IsComplement(pObjMapped) );
        if ( pNew->vFlopReprs && i >= nTruePis && pObj != pObjMapped )
        {
            Vec_IntPush( pNew->vFlopReprs, Aig_ObjCioId(pObj) );
            if ( Aig_ObjIsConst1( Aig_Regular(pObjMapped) ) )
                Vec_IntPush( pNew->vFlopReprs, -1 );
            else
            {
                assert( !Aig_IsComplement(pObjMapped) );
                assert( Aig_ObjIsCi(pObjMapped) );
                assert( Aig_ObjCioId(pObj) != Aig_ObjCioId(pObjMapped) );
                Vec_IntPush( pNew->vFlopReprs, Aig_ObjCioId(pObjMapped) );
            }
        }
    }
    if ( p->vFlopReprs )
    {
        Aig_ManForEachLoSeq( p, pObj, i )
            pObj->pNext = NULL;
    }
    // duplicate internal nodes
    Aig_ManForEachObj( p, pObj, i )
        if ( Aig_ObjIsBuf(pObj) )
            pObj->pData = Aig_ObjChild0Copy(pObj);
        else if ( Aig_ObjIsNode(pObj) )
            pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // add the POs
    Aig_ManForEachCo( p, pObj, i )
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    assert( Aig_ManNodeNum(p) >= Aig_ManNodeNum(pNew) );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManRemap(): The check has failed.\n" );
    return pNew;
}